

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::OP_DeleteElementI_UInt32
              (Var instance,uint32 index,ScriptContext *scriptContext,
              PropertyOperationFlags propertyOperationFlags)

{
  Var pvVar1;
  PropertyOperationFlags propertyOperationFlags_local;
  ScriptContext *scriptContext_local;
  uint32 index_local;
  Var instance_local;
  
  pvVar1 = JavascriptNumber::ToVar(index,scriptContext);
  pvVar1 = OP_DeleteElementI(instance,pvVar1,scriptContext,propertyOperationFlags);
  return pvVar1;
}

Assistant:

Var JavascriptOperators::OP_DeleteElementI_UInt32(Var instance, uint32 index, ScriptContext* scriptContext, PropertyOperationFlags propertyOperationFlags)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_DeleteElementI_UInt32);
        JIT_HELPER_SAME_ATTRIBUTES(Op_DeleteElementI_UInt32, Op_DeleteElementI);
#if FLOATVAR
        return OP_DeleteElementI(instance, Js::JavascriptNumber::ToVar(index, scriptContext), scriptContext, propertyOperationFlags);
#else
        char buffer[sizeof(Js::JavascriptNumber)];
        return OP_DeleteElementI(instance, Js::JavascriptNumber::ToVarInPlace(index, scriptContext,
            (Js::JavascriptNumber *)buffer), scriptContext, propertyOperationFlags);
#endif
        JIT_HELPER_END(Op_DeleteElementI_UInt32);
    }